

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

bool DoesConstantIntegerMatch(VmValue *value,longlong number)

{
  bool bVar1;
  VmConstant *pVVar2;
  VmConstant *constant;
  longlong number_local;
  VmValue *value_local;
  
  pVVar2 = getType<VmConstant>(value);
  if (pVVar2 != (VmConstant *)0x0) {
    bVar1 = VmType::operator==(&(pVVar2->super_VmValue).type,&VmType::Int);
    if (bVar1) {
      return pVVar2->iValue == number;
    }
    bVar1 = VmType::operator==(&(pVVar2->super_VmValue).type,&VmType::Long);
    if (bVar1) {
      return pVVar2->lValue == number;
    }
  }
  return false;
}

Assistant:

bool DoesConstantIntegerMatch(VmValue* value, long long number)
{
	if(VmConstant *constant = getType<VmConstant>(value))
	{
		if(constant->type == VmType::Int)
			return constant->iValue == number;

		if(constant->type == VmType::Long)
			return constant->lValue == number;
	}

	return false;
}